

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

int __thiscall
cmMakefile::TryCompile
          (cmMakefile *this,string *srcdir,string *bindir,string *projectName,string *targetName,
          bool fast,int jobs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmakeArgs,string *output)

{
  pointer *ppuVar1;
  pointer ppcVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  long *plVar6;
  cmValue cVar7;
  _Base_ptr p_Var8;
  pointer puVar9;
  size_type *psVar10;
  _Base_ptr p_Var11;
  undefined1 local_950 [32];
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> gg;
  __uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  string *local_900;
  string *local_8f8;
  _Base_ptr local_8f0 [2];
  _Base_ptr local_8e0 [2];
  cmWorkingDirectory workdir;
  cmake cm;
  
  this->IsSourceFileTryCompile = fast;
  local_8f8 = projectName;
  bVar3 = cmsys::SystemTools::FileIsDirectory(bindir);
  if (!bVar3) {
    cmsys::SystemTools::MakeDirectory(bindir,(mode_t *)0x0);
  }
  cmWorkingDirectory::cmWorkingDirectory(&workdir,bindir);
  if (workdir.ResultCode != 0) {
    std::operator+(&local_920,"Failed to set working directory to ",bindir);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_920);
    p_Var8 = (_Base_ptr)(plVar6 + 2);
    if ((_Base_ptr)*plVar6 == p_Var8) {
      local_950._16_8_ = *(undefined8 *)p_Var8;
      local_950._24_8_ = plVar6[3];
      local_950._0_8_ = (_Base_ptr)(local_950 + 0x10);
    }
    else {
      local_950._16_8_ = *(undefined8 *)p_Var8;
      local_950._0_8_ = (_Base_ptr)*plVar6;
    }
    local_950._8_8_ = plVar6[1];
    *plVar6 = (long)p_Var8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    strerror(workdir.ResultCode);
    plVar6 = (long *)std::__cxx11::string::append(local_950);
    ppuVar1 = &cm.Generators.
               super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    puVar9 = (pointer)(plVar6 + 2);
    if ((pointer)*plVar6 == puVar9) {
      cm.Generators.
      super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)(puVar9->_M_t).
                    super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                    .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl;
      cm.ExtraGenerators.
      super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar6[3];
      cm.Generators.
      super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
    }
    else {
      cm.Generators.
      super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)(puVar9->_M_t).
                    super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                    .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl;
      cm.Generators.
      super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar6;
    }
    cm.Generators.
    super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar6[1];
    *plVar6 = (long)puVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    ppcVar2 = (this->ExecutionStatusStack).
              super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((this->ExecutionStatusStack).
        super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
        super__Vector_impl_data._M_start != ppcVar2) {
      ppcVar2[-1]->NestedError = true;
    }
    cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,(string *)&cm,
                        &this->Backtrace);
    if (cm.Generators.
        super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppuVar1) {
      operator_delete(cm.Generators.
                      super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((cm.Generators.
                                       super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
                                     super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                                     .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>.
                                     _M_head_impl + 1));
    }
    if ((_Base_ptr)local_950._0_8_ != (_Base_ptr)(local_950 + 0x10)) {
      operator_delete((void *)local_950._0_8_,(ulong)(local_950._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_920._M_dataplus._M_p != &local_920.field_2) {
      operator_delete(local_920._M_dataplus._M_p,local_920.field_2._M_allocated_capacity + 1);
    }
    cmSystemTools::s_FatalErrorOccurred = true;
    this->IsSourceFileTryCompile = false;
    iVar5 = 1;
    goto LAB_002a74c8;
  }
  cmake::cmake(&cm,RoleProject,Project,TryCompile);
  (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(local_950);
  local_900 = targetName;
  cmake::CreateGlobalGenerator((cmake *)&gg,(string *)&cm,SUB81(local_950,0));
  p_Var8 = (_Base_ptr)(local_950 + 0x10);
  if ((_Base_ptr)local_950._0_8_ != p_Var8) {
    operator_delete((void *)local_950._0_8_,(ulong)(local_950._16_8_ + 1));
  }
  local_950._0_8_ = p_Var8;
  if ((__uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>)
      gg._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t
      .super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
      super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>)0x0) {
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(local_8f0);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)local_8f0,0,(char *)0x0,0x76bd7f);
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_920.field_2._M_allocated_capacity = *psVar10;
      local_920.field_2._8_8_ = plVar6[3];
      local_920._M_dataplus._M_p = (pointer)&local_920.field_2;
    }
    else {
      local_920.field_2._M_allocated_capacity = *psVar10;
      local_920._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_920._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_920);
    p_Var11 = (_Base_ptr)(plVar6 + 2);
    if ((_Base_ptr)*plVar6 == p_Var11) {
      local_950._16_8_ = *(undefined8 *)p_Var11;
      local_950._24_8_ = plVar6[3];
    }
    else {
      local_950._16_8_ = *(undefined8 *)p_Var11;
      local_950._0_8_ = (_Base_ptr)*plVar6;
    }
    local_950._8_8_ = plVar6[1];
    *plVar6 = (long)p_Var11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    ppcVar2 = (this->ExecutionStatusStack).
              super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((this->ExecutionStatusStack).
        super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
        super__Vector_impl_data._M_start != ppcVar2) {
      ppcVar2[-1]->NestedError = true;
    }
    cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,INTERNAL_ERROR,(string *)local_950,
                        &this->Backtrace);
    if ((_Base_ptr)local_950._0_8_ != p_Var8) {
      operator_delete((void *)local_950._0_8_,(ulong)(local_950._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_920._M_dataplus._M_p != &local_920.field_2) {
      operator_delete(local_920._M_dataplus._M_p,local_920.field_2._M_allocated_capacity + 1);
    }
    if (local_8f0[0] != (_Base_ptr)local_8e0) {
LAB_002a748d:
      operator_delete(local_8f0[0],(ulong)((long)&local_8e0[0]->_M_color + 1));
    }
LAB_002a7495:
    cmSystemTools::s_FatalErrorOccurred = true;
    iVar5 = 1;
  }
  else {
    *(int *)((long)gg._M_t.
                   super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                   .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 0x30) =
         this->RecursionDepth;
    local_928._M_t.
    super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
    super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
         (tuple<cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
         (tuple<cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
         gg._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
         _M_t.super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
         super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
    gg._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
    super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
    super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         (__uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>)0x0;
    cmake::SetGlobalGenerator
              (&cm,(unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                   &local_928);
    if ((_Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
        local_928._M_t.
        super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
        super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl != (cmGlobalGenerator *)0x0)
    {
      (**(code **)(*(long *)local_928._M_t.
                            super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                            .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 8))();
    }
    local_928._M_t.
    super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
    super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
         (tuple<cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
         (_Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)0x0;
    cmake::SetTraceRedirect(&cm,this->GlobalGenerator->CMakeInstance);
    cmake::SetHomeDirectory(&cm,srcdir);
    cmake::SetHomeOutputDirectory(&cm,bindir);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_950,"CMAKE_GENERATOR_INSTANCE","");
    GetDefinition(this,(string *)local_950);
    std::__cxx11::string::_M_assign((string *)&cm.GeneratorInstance);
    cm.GeneratorInstanceSet = true;
    if ((_Base_ptr)local_950._0_8_ != p_Var8) {
      operator_delete((void *)local_950._0_8_,(ulong)(local_950._16_8_ + 1));
    }
    local_950._0_8_ = p_Var8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_950,"CMAKE_GENERATOR_PLATFORM","");
    GetDefinition(this,(string *)local_950);
    std::__cxx11::string::_M_assign((string *)&cm.GeneratorPlatform);
    cm.GeneratorPlatformSet = true;
    if ((_Base_ptr)local_950._0_8_ != p_Var8) {
      operator_delete((void *)local_950._0_8_,(ulong)(local_950._16_8_ + 1));
    }
    local_950._0_8_ = p_Var8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_950,"CMAKE_GENERATOR_TOOLSET","");
    GetDefinition(this,(string *)local_950);
    std::__cxx11::string::_M_assign((string *)&cm.GeneratorToolset);
    cm.GeneratorToolsetSet = true;
    if ((_Base_ptr)local_950._0_8_ != p_Var8) {
      operator_delete((void *)local_950._0_8_,(ulong)(local_950._16_8_ + 1));
    }
    cmake::LoadCache(&cm);
    cVar4 = (**(code **)(*(long *)cm.GlobalGenerator._M_t.
                                  super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                                  .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl +
                        0x130))();
    if (cVar4 == '\0') {
      local_950._0_8_ = p_Var8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_950,"CMAKE_TRY_COMPILE_CONFIGURATION","");
      cVar7 = GetDefinition(this,(string *)local_950);
      if ((_Base_ptr)local_950._0_8_ != p_Var8) {
        operator_delete((void *)local_950._0_8_,(ulong)(local_950._16_8_ + 1));
      }
      if (cVar7.Value != (string *)0x0) {
        local_950._0_8_ = p_Var8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_950,"CMAKE_BUILD_TYPE","");
        cmake::AddCacheEntry(&cm,(string *)local_950,cVar7,"Build configuration",3);
        if ((_Base_ptr)local_950._0_8_ != p_Var8) {
          operator_delete((void *)local_950._0_8_,(ulong)(local_950._16_8_ + 1));
        }
      }
    }
    local_950._0_8_ = p_Var8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_950,"CMAKE_MAXIMUM_RECURSION_DEPTH","");
    cVar7 = GetDefinition(this,(string *)local_950);
    if ((_Base_ptr)local_950._0_8_ != p_Var8) {
      operator_delete((void *)local_950._0_8_,(ulong)(local_950._16_8_ + 1));
    }
    if (cVar7.Value != (string *)0x0) {
      local_950._0_8_ = p_Var8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_950,"CMAKE_MAXIMUM_RECURSION_DEPTH","");
      cmake::AddCacheEntry(&cm,(string *)local_950,cVar7,"Maximum recursion depth",3);
      if ((_Base_ptr)local_950._0_8_ != p_Var8) {
        operator_delete((void *)local_950._0_8_,(ulong)(local_950._16_8_ + 1));
      }
    }
    if (cmakeArgs !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      cm.WarnUnusedCli = false;
      cmake::SetCacheArgs(&cm,cmakeArgs);
    }
    cmGlobalGenerator::EnableLanguagesFromGenerator
              ((cmGlobalGenerator *)
               cm.GlobalGenerator._M_t.
               super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
               super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,this->GlobalGenerator,
               this);
    local_950._0_8_ = p_Var8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_950,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS","");
    bVar3 = IsOn(this,(string *)local_950);
    if ((_Base_ptr)local_950._0_8_ != p_Var8) {
      operator_delete((void *)local_950._0_8_,(ulong)(local_950._16_8_ + 1));
    }
    if (bVar3) {
      local_950._0_8_ = p_Var8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_950,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS","");
      cmake::AddCacheEntry(&cm,(string *)local_950,"TRUE","",4);
    }
    else {
      local_950._0_8_ = p_Var8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_950,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS","");
      cmake::AddCacheEntry(&cm,(string *)local_950,"FALSE","",4);
    }
    if ((_Base_ptr)local_950._0_8_ != p_Var8) {
      operator_delete((void *)local_950._0_8_,(ulong)(local_950._16_8_ + 1));
    }
    iVar5 = cmake::Configure(&cm);
    if (iVar5 != 0) {
      local_950._0_8_ = p_Var8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_950,"Failed to configure test project build system.","");
      ppcVar2 = (this->ExecutionStatusStack).
                super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if ((this->ExecutionStatusStack).
          super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
          super__Vector_impl_data._M_start != ppcVar2) {
        ppcVar2[-1]->NestedError = true;
      }
      cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,(string *)local_950,
                          &this->Backtrace);
LAB_002a7389:
      local_8e0[0] = (_Base_ptr)local_950._16_8_;
      local_8f0[0] = (_Base_ptr)local_950._0_8_;
      if ((_Base_ptr)local_950._0_8_ != p_Var8) goto LAB_002a748d;
      goto LAB_002a7495;
    }
    iVar5 = cmake::Generate(&cm);
    if (iVar5 != 0) {
      local_950._0_8_ = p_Var8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_950,"Failed to generate test project build system.","");
      ppcVar2 = (this->ExecutionStatusStack).
                super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if ((this->ExecutionStatusStack).
          super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
          super__Vector_impl_data._M_start != ppcVar2) {
        ppcVar2[-1]->NestedError = true;
      }
      cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,(string *)local_950,
                          &this->Backtrace);
      goto LAB_002a7389;
    }
    iVar5 = cmGlobalGenerator::TryCompile
                      (this->GlobalGenerator,jobs,srcdir,bindir,local_8f8,local_900,fast,output,this
                      );
  }
  this->IsSourceFileTryCompile = false;
  if ((__uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>)
      gg._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t
      .super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
      super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>)0x0) {
    (**(code **)(*(long *)gg._M_t.
                          super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                          .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 8))();
  }
  cmake::~cmake(&cm);
LAB_002a74c8:
  cmWorkingDirectory::~cmWorkingDirectory(&workdir);
  return iVar5;
}

Assistant:

int cmMakefile::TryCompile(const std::string& srcdir,
                           const std::string& bindir,
                           const std::string& projectName,
                           const std::string& targetName, bool fast, int jobs,
                           const std::vector<std::string>* cmakeArgs,
                           std::string& output)
{
  this->IsSourceFileTryCompile = fast;
  // does the binary directory exist ? If not create it...
  if (!cmSystemTools::FileIsDirectory(bindir)) {
    cmSystemTools::MakeDirectory(bindir);
  }

  // change to the tests directory and run cmake
  // use the cmake object instead of calling cmake
  cmWorkingDirectory workdir(bindir);
  if (workdir.Failed()) {
    this->IssueMessage(MessageType::FATAL_ERROR,
                       "Failed to set working directory to " + bindir + " : " +
                         std::strerror(workdir.GetLastResult()));
    cmSystemTools::SetFatalErrorOccurred();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  // make sure the same generator is used
  // use this program as the cmake to be run, it should not
  // be run that way but the cmake object requires a vailid path
  cmake cm(cmake::RoleProject, cmState::Project,
           cmState::ProjectKind::TryCompile);
  auto gg = cm.CreateGlobalGenerator(this->GetGlobalGenerator()->GetName());
  if (!gg) {
    this->IssueMessage(MessageType::INTERNAL_ERROR,
                       "Global generator '" +
                         this->GetGlobalGenerator()->GetName() +
                         "' could not be created.");
    cmSystemTools::SetFatalErrorOccurred();
    this->IsSourceFileTryCompile = false;
    return 1;
  }
  gg->RecursionDepth = this->RecursionDepth;
  cm.SetGlobalGenerator(std::move(gg));

  // copy trace state
  cm.SetTraceRedirect(this->GetCMakeInstance());

  // do a configure
  cm.SetHomeDirectory(srcdir);
  cm.SetHomeOutputDirectory(bindir);
  cm.SetGeneratorInstance(this->GetSafeDefinition("CMAKE_GENERATOR_INSTANCE"));
  cm.SetGeneratorPlatform(this->GetSafeDefinition("CMAKE_GENERATOR_PLATFORM"));
  cm.SetGeneratorToolset(this->GetSafeDefinition("CMAKE_GENERATOR_TOOLSET"));
  cm.LoadCache();
  if (!cm.GetGlobalGenerator()->IsMultiConfig()) {
    if (cmValue config =
          this->GetDefinition("CMAKE_TRY_COMPILE_CONFIGURATION")) {
      // Tell the single-configuration generator which one to use.
      // Add this before the user-provided CMake arguments in case
      // one of the arguments is -DCMAKE_BUILD_TYPE=...
      cm.AddCacheEntry("CMAKE_BUILD_TYPE", config, "Build configuration",
                       cmStateEnums::STRING);
    }
  }
  cmValue recursionDepth =
    this->GetDefinition("CMAKE_MAXIMUM_RECURSION_DEPTH");
  if (recursionDepth) {
    cm.AddCacheEntry("CMAKE_MAXIMUM_RECURSION_DEPTH", recursionDepth,
                     "Maximum recursion depth", cmStateEnums::STRING);
  }
  // if cmake args were provided then pass them in
  if (cmakeArgs) {
    // FIXME: Workaround to ignore unused CLI variables in try-compile.
    //
    // Ideally we should use SetArgs for options like --no-warn-unused-cli.
    // However, there is a subtle problem when certain arguments are passed to
    // a macro wrapping around try_compile or try_run that does not escape
    // semicolons in its parameters but just passes ${ARGV} or ${ARGN}.  In
    // this case a list argument like "-DVAR=a;b" gets split into multiple
    // cmake arguments "-DVAR=a" and "b".  Currently SetCacheArgs ignores
    // argument "b" and uses just "-DVAR=a", leading to a subtle bug in that
    // the try_compile or try_run does not get the proper value of VAR.  If we
    // call SetArgs here then it would treat "b" as the source directory and
    // cause an error such as "The source directory .../CMakeFiles/CMakeTmp/b
    // does not exist", thus breaking the try_compile or try_run completely.
    //
    // Strictly speaking the bug is in the wrapper macro because the CMake
    // language has always flattened nested lists and the macro should escape
    // the semicolons in its arguments before forwarding them.  However, this
    // bug is so subtle that projects typically work anyway, usually because
    // the value VAR=a is sufficient for the try_compile or try_run to get the
    // correct result.  Calling SetArgs here would break such projects that
    // previously built.  Instead we work around the issue by never reporting
    // unused arguments and ignoring options such as --no-warn-unused-cli.
    cm.SetWarnUnusedCli(false);
    // cm.SetArgs(*cmakeArgs, true);

    cm.SetCacheArgs(*cmakeArgs);
  }
  // to save time we pass the EnableLanguage info directly
  cm.GetGlobalGenerator()->EnableLanguagesFromGenerator(
    this->GetGlobalGenerator(), this);
  if (this->IsOn("CMAKE_SUPPRESS_DEVELOPER_WARNINGS")) {
    cm.AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "TRUE", "",
                     cmStateEnums::INTERNAL);
  } else {
    cm.AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "FALSE", "",
                     cmStateEnums::INTERNAL);
  }
  if (cm.Configure() != 0) {
    this->IssueMessage(MessageType::FATAL_ERROR,
                       "Failed to configure test project build system.");
    cmSystemTools::SetFatalErrorOccurred();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  if (cm.Generate() != 0) {
    this->IssueMessage(MessageType::FATAL_ERROR,
                       "Failed to generate test project build system.");
    cmSystemTools::SetFatalErrorOccurred();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  // finally call the generator to actually build the resulting project
  int ret = this->GetGlobalGenerator()->TryCompile(
    jobs, srcdir, bindir, projectName, targetName, fast, output, this);

  this->IsSourceFileTryCompile = false;
  return ret;
}